

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int https_open_network(char *filename,curlmembuf *buffer)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  
  sVar2 = strlen(filename);
  __dest = (char *)malloc(sVar2 + 0xc);
  builtin_strncpy(__dest,"https://",9);
  strcat(__dest,filename);
  iVar1 = ssl_get_with_curl(__dest,buffer,(char *)0x0,(char *)0x0);
  free(__dest);
  return iVar1;
}

Assistant:

int https_open_network(char *filename, curlmembuf* buffer)
{
  int status=0;
  char *urlname=0;
  
  /* urlname may have .gz or .Z appended to it */
  urlname = (char *)malloc(strlen(filename)+12);
  strcpy(urlname,"https://");
  strcat(urlname,filename);
  status = ssl_get_with_curl(urlname, buffer, 0, 0);
  free(urlname);
  return(status);
}